

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureAlloc.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmTextureCalc::MSAACompression(GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  GMM_STATUS GVar1;
  GMM_STATUS Status;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  
  if (((pTexInfo->MSAA).NumSamples == 2) || ((pTexInfo->MSAA).NumSamples == 4)) {
    pTexInfo->BitsPerPixel = 8;
    pTexInfo->Format = GMM_FORMAT_R8_UINT;
  }
  else if ((pTexInfo->MSAA).NumSamples == 8) {
    pTexInfo->BitsPerPixel = 0x20;
    pTexInfo->Format = GMM_FORMAT_R32_UINT;
  }
  else {
    pTexInfo->BitsPerPixel = 0x40;
    pTexInfo->Format = GMM_FORMAT_GENERIC_64BIT;
  }
  GVar1 = __GmmTexFillHAlignVAlign(pTexInfo,this->pGmmLibContext);
  if (GVar1 == GMM_SUCCESS) {
    (pTexInfo->MSAA).NumSamples = 1;
    (pTexInfo->Flags).Gpu =
         (anon_struct_8_45_9b07292e_for_Gpu)
         ((ulong)(pTexInfo->Flags).Gpu & 0xfffffbffffffffff | 0x40000000000);
  }
  return GVar1;
}

Assistant:

GMM_STATUS GmmLib::GmmTextureCalc::MSAACompression(GMM_TEXTURE_INFO *pTexInfo)
{
    GMM_STATUS Status = GMM_SUCCESS;

    if((pTexInfo->MSAA.NumSamples == 2) || (pTexInfo->MSAA.NumSamples == 4))
    {
        pTexInfo->BitsPerPixel = 8;
        pTexInfo->Format       = GMM_FORMAT_R8_UINT;
    }
    else if(pTexInfo->MSAA.NumSamples == 8)
    {
        pTexInfo->BitsPerPixel = 32;
        pTexInfo->Format       = GMM_FORMAT_R32_UINT;
    }
    else //if(pTexInfo->MSAA.NumSamples == 16)
    {
        pTexInfo->BitsPerPixel = 64;
        pTexInfo->Format       = GMM_FORMAT_GENERIC_64BIT;
    }

    if((Status = __GmmTexFillHAlignVAlign(pTexInfo, pGmmLibContext)) != GMM_SUCCESS) // Need to get our alignment (matching RT) before overwriting our RT's MSAA setting.
    {
        return Status;
    }
    pTexInfo->MSAA.NumSamples         = 1; // CCS itself isn't MSAA'ed.
    pTexInfo->Flags.Gpu.__MsaaTileMcs = 1;

    return Status;
}